

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  void *pvVar9;
  undefined8 *puVar10;
  MessageLite *msg_00;
  ushort *p_00;
  char *pcVar11;
  Nonnull<const_char_*> pcVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  ulong uVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  long *plVar15;
  char *p;
  ParseContext *ptr_00;
  ParseContext *pPVar16;
  ushort uVar17;
  uint *puVar18;
  ParseContext *this;
  pair<const_char_*,_unsigned_int> pVar19;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_68;
  int local_4c;
  int local_48;
  ParseContext *local_38;
  
  puVar18 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar18 & 3) != 0) {
    AlignFail(puVar18);
  }
  uVar3 = *(ushort *)((long)puVar18 + 10);
  if ((ulong)(uVar3 & 0x30) == 0x20) {
    pcVar12 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        ((ulong)(uVar3 & 0x30),0x20,
                         "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                        );
  }
  if (pcVar12 == (Nonnull<const_char_*>)0x0) {
    if ((uVar3 & 0x1c0) == 0) {
      pcVar12 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar3 & 0x1c0,0,
                           "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepMessage)"
                          );
    }
    if (pcVar12 == (Nonnull<const_char_*>)0x0) {
      if ((data.field_0._0_4_ & 7) != 2) {
        UNRECOVERED_JUMPTABLE = table->fallback;
LAB_002d8e60:
        pcVar11 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar11;
      }
      pvVar9 = MaybeGetSplitBase(msg,true,table);
      plVar15 = (long *)((ulong)*puVar18 + (long)pvVar9);
      if (((ulong)plVar15 & 7) != 0) {
        AlignFail(plVar15);
      }
      this = (ParseContext *)hasbits;
      if ((undefined1 *)*plVar15 == kZeroBuffer) {
        this = (ParseContext *)(msg->_internal_metadata_).ptr_;
        if (((ulong)this & 1) != 0) {
          this = *(ParseContext **)((ulong)this & 0xfffffffffffffffe);
        }
        if (this == (ParseContext *)0x0) {
          puVar10 = (undefined8 *)operator_new(0x18);
          *puVar10 = 0;
          puVar10[1] = 0;
          puVar10[2] = 0;
        }
        else {
          puVar10 = (undefined8 *)Arena::Allocate((Arena *)this,0x18);
          *puVar10 = 0;
          puVar10[1] = 0;
          puVar10[2] = this;
        }
        *plVar15 = (long)puVar10;
      }
      local_38 = (ParseContext *)*plVar15;
      local_68 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&table->has_bits_offset +
                  (ulong)(ushort)puVar18[2] * 8 + (ulong)table->aux_offset);
      uVar17 = uVar3 >> 9 & 3;
      if (uVar17 != 2) {
        if ((uVar3 >> 9 & 3) == 0) {
          MpRepeatedMessageOrGroup<true,false>((TcParser *)&stack0xffffffffffffffb8);
          goto LAB_002d8fbc;
        }
        if (uVar17 != 1) {
          local_68.data = *local_68.data;
        }
        local_68.data = (uint64_t)MessageLite::GetTcParseTable(local_68.data);
      }
      do {
        ptr_00 = local_38;
        msg_00 = AddMessage((TcParseTableBase *)local_68,(RepeatedPtrFieldBase *)local_38);
        pVar19._8_8_ = extraout_RDX;
        pVar19.first = (char *)msg_00;
        bVar1 = (byte)*(ushort *)ptr;
        aVar14.data._1_7_ = 0;
        aVar14.data._0_1_ = bVar1;
        if ((char)bVar1 < '\0') {
          ptr_00 = (ParseContext *)(ulong)(uint)bVar1;
          pVar19 = (pair<const_char_*,_unsigned_int>)ReadSizeFallback(ptr,(uint)bVar1);
          pPVar16 = (ParseContext *)pVar19.first;
          aVar14.data = pVar19._8_8_ & 0xffffffff;
        }
        else {
          pPVar16 = (ParseContext *)((long)ptr + 1);
        }
        if ((pPVar16 == (ParseContext *)0x0) || (ctx->depth_ < 1)) {
          pPVar16 = (ParseContext *)0x0;
        }
        else {
          ptr_00 = ctx;
          EpsCopyInputStream::PushLimit
                    ((EpsCopyInputStream *)&stack0xffffffffffffffb8,(char *)ctx,(int)pPVar16);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = extraout_RDX_00;
          pVar19 = (pair<const_char_*,_unsigned_int>)(auVar4 << 0x40);
          local_4c = local_48;
          ctx->depth_ = ctx->depth_ + -1;
        }
        if (pPVar16 == (ParseContext *)0x0) {
LAB_002d8dc4:
          p_00 = (ushort *)0x0;
        }
        else {
          iVar8 = ctx->depth_;
          aVar14 = local_68;
          p_00 = (ushort *)
                 ParseLoopPreserveNone(msg_00,(char *)pPVar16,ctx,(TcParseTableBase *)local_68);
          uVar13 = extraout_RDX_01;
          if (p_00 != (ushort *)0x0) {
            pPVar16 = (ParseContext *)(long)ctx->depth_;
            if (iVar8 == ctx->depth_) {
              pcVar12 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  ((long)iVar8,(long)pPVar16,"old_depth == depth_");
              uVar13 = extraout_RDX_02;
            }
            if (pcVar12 != (Nonnull<const_char_*>)0x0) {
              MpRepeatedMessageOrGroup<true,false>();
              goto LAB_002d8fce;
            }
          }
          ctx->depth_ = ctx->depth_ + 1;
          uVar7 = (ctx->super_EpsCopyInputStream).limit_ + local_4c;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar13;
          pVar19 = (pair<const_char_*,_unsigned_int>)(auVar5 << 0x40);
          (ctx->super_EpsCopyInputStream).limit_ = uVar7;
          ptr_00 = pPVar16;
          if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_002d8dc4;
          aVar14._0_4_ = (int)uVar7 >> 0x1f & uVar7;
          aVar14.data._4_4_ = 0;
          pcVar11 = (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar14._0_4_;
          pVar19._8_8_ = uVar13;
          pVar19.first = pcVar11;
          (ctx->super_EpsCopyInputStream).limit_end_ = pcVar11;
        }
        pPVar16 = pVar19._8_8_;
        if (p_00 == (ushort *)0x0) {
          iVar8 = 8;
        }
        else if (p_00 < (ctx->super_EpsCopyInputStream).limit_end_) {
          bVar1 = (byte)*p_00;
          ptr = (char *)((long)p_00 + 1);
          this = (ParseContext *)(ulong)bVar1;
          if ((char)bVar1 < '\0') {
            bVar2 = *ptr;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = pPVar16;
            pVar19 = (pair<const_char_*,_unsigned_int>)(auVar6 << 0x40);
            aVar14.data = (ulong)bVar2 << 7;
            uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            pPVar16 = (ParseContext *)(ulong)uVar7;
            if ((char)bVar2 < '\0') {
              pVar19 = ReadTagFallback((char *)p_00,uVar7);
              ptr = pVar19.first;
              this = (ParseContext *)(ulong)pVar19.second;
              ptr_00 = pPVar16;
            }
            else {
              ptr = (char *)(p_00 + 1);
              this = pPVar16;
            }
          }
          pPVar16 = pVar19._8_8_;
          iVar8 = (uint)((ushort *)ptr == (ushort *)0x0) << 3;
        }
        else {
          iVar8 = 9;
        }
        if (iVar8 != 0) {
          if (iVar8 == 8) {
            pcVar11 = Error(msg,(char *)ptr_00,pPVar16,(TcFieldData)aVar14,table,hasbits);
            return pcVar11;
          }
          uVar13 = (ulong)table->has_bits_offset;
          if (uVar13 == 0) {
            return (char *)p_00;
          }
          goto LAB_002d8ef7;
        }
      } while ((uint)this == data.field_0._0_4_);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p_00) {
        uVar13 = (ulong)table->has_bits_offset;
        if (uVar13 != 0) {
LAB_002d8ef7:
          puVar18 = (uint *)((long)&msg->_vptr_MessageLite + uVar13);
          if (((ulong)puVar18 & 3) != 0) {
LAB_002d8fbc:
            AlignFail();
          }
          *puVar18 = *puVar18 | (uint)hasbits;
        }
        return (char *)p_00;
      }
      uVar7 = (uint)table->fast_idx_mask & (uint)*p_00;
      if ((uVar7 & 7) == 0) {
        uVar13 = (ulong)(uVar7 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*p_00 ^ *(ulong *)(&table[1].fast_idx_mask + uVar13 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar13);
        ptr = (char *)p_00;
        goto LAB_002d8e60;
      }
      goto LAB_002d8fe8;
    }
  }
  else {
LAB_002d8fce:
    MpRepeatedMessageOrGroup<true,false>();
  }
  MpRepeatedMessageOrGroup<true,false>();
LAB_002d8fe8:
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}